

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewAppendableFile
          (PosixEnv *this,string *filename,WritableFile **result)

{
  int fd;
  PosixWritableFile *this_00;
  int *piVar1;
  undefined8 *in_RCX;
  string local_50;
  
  fd = open((char *)*result,0x80441,0x1a4);
  if (fd < 0) {
    *in_RCX = 0;
    piVar1 = __errno_location();
    PosixError((anon_unknown_1 *)this,(string *)result,*piVar1);
  }
  else {
    this_00 = (PosixWritableFile *)operator_new(0x10058);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,*result,
               (long)&(*result)->_vptr_WritableFile + (long)&result[1]->_vptr_WritableFile);
    PosixWritableFile::PosixWritableFile(this_00,&local_50,fd);
    *in_RCX = this_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    (this->super_Env)._vptr_Env = (_func_int **)0x0;
  }
  return (Status)(char *)this;
}

Assistant:

Status NewAppendableFile(const std::string& filename,
                           WritableFile** result) override {
    int fd = ::open(filename.c_str(),
                    O_APPEND | O_WRONLY | O_CREAT | kOpenBaseFlags, 0644);
    if (fd < 0) {
      *result = nullptr;
      return PosixError(filename, errno);
    }

    *result = new PosixWritableFile(filename, fd);
    return Status::OK();
  }